

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O2

void __thiscall IGameController::CheckTeamBalance(IGameController *this)

{
  long lVar1;
  IConsole *pIVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  char aBuf [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_GameFlags & 1) == 0) || (this->m_pConfig->m_SvTeambalanceTime == 0)) {
    this->m_UnbalancedTick = -1;
    goto LAB_00119b72;
  }
  uVar3 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if (uVar5 < 2) {
    str_format(aBuf,0x100,"Teams are balanced (red=%d blue=%d)");
    iVar4 = -1;
LAB_00119b4e:
    this->m_UnbalancedTick = iVar4;
  }
  else {
    str_format(aBuf,0x100,"Teams are NOT balanced (red=%d blue=%d)");
    if (this->m_UnbalancedTick < 0) {
      iVar4 = this->m_pServer->m_CurrentGameTick;
      goto LAB_00119b4e;
    }
  }
  pIVar2 = this->m_pGameServer->m_pConsole;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])(pIVar2,2,"game",aBuf,0);
LAB_00119b72:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IGameController::CheckTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime)
	{
		m_UnbalancedTick = TBALANCE_OK;
		return;
	}

	// check if teams are unbalanced
	char aBuf[256];
	if(absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) >= NUM_TEAMS)
	{
		str_format(aBuf, sizeof(aBuf), "Teams are NOT balanced (red=%d blue=%d)", m_aTeamSize[TEAM_RED], m_aTeamSize[TEAM_BLUE]);
		if(m_UnbalancedTick <= TBALANCE_OK)
			m_UnbalancedTick = Server()->Tick();
	}
	else
	{
		str_format(aBuf, sizeof(aBuf), "Teams are balanced (red=%d blue=%d)", m_aTeamSize[TEAM_RED], m_aTeamSize[TEAM_BLUE]);
		m_UnbalancedTick = TBALANCE_OK;
	}
	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
}